

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_add.c
# Opt level: O0

int BN_usub(BIGNUM *r,BIGNUM *a,BIGNUM *b)

{
  int num;
  ulong uVar1;
  BIGNUM *pBVar2;
  bool bVar3;
  unsigned_long *bp;
  unsigned_long *ap;
  unsigned_long *rp;
  unsigned_long borrow;
  unsigned_long t2;
  unsigned_long t1;
  int dif;
  int min;
  int max;
  int in_stack_ffffffffffffff9c;
  BIGNUM *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  int line;
  ulong *puVar4;
  char *in_stack_ffffffffffffffb0;
  ulong *puVar5;
  ulong local_48;
  int local_2c;
  int local_24;
  int local_4;
  
  line = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_24 = a->top;
  num = b->top;
  local_2c = local_24 - num;
  if (local_2c < 0) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffb0,line,(char *)in_stack_ffffffffffffffa0);
    ERR_set_error(3,100,(char *)0x0);
    local_4 = 0;
  }
  else {
    pBVar2 = bn_wexpand(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    if (pBVar2 == (BIGNUM *)0x0) {
      local_4 = 0;
    }
    else {
      puVar4 = a->d;
      puVar5 = r->d;
      local_48 = bn_sub_words(puVar5,puVar4,b->d,num);
      puVar4 = puVar4 + num;
      puVar5 = puVar5 + num;
      while (local_2c != 0) {
        local_2c = local_2c + -1;
        uVar1 = *puVar4;
        *puVar5 = uVar1 - local_48;
        local_48 = (long)(int)(uint)(uVar1 == 0) & local_48;
        puVar4 = puVar4 + 1;
        puVar5 = puVar5 + 1;
      }
      while( true ) {
        bVar3 = false;
        puVar4 = puVar5;
        if (local_24 != 0) {
          puVar4 = puVar5 + -1;
          bVar3 = puVar5[-1] == 0;
        }
        if (!bVar3) break;
        local_24 = local_24 + -1;
        puVar5 = puVar4;
      }
      r->top = local_24;
      r->neg = 0;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int BN_usub(BIGNUM *r, const BIGNUM *a, const BIGNUM *b)
{
    int max, min, dif;
    BN_ULONG t1, t2, borrow, *rp;
    const BN_ULONG *ap, *bp;

    bn_check_top(a);
    bn_check_top(b);

    max = a->top;
    min = b->top;
    dif = max - min;

    if (dif < 0) {              /* hmm... should not be happening */
        ERR_raise(ERR_LIB_BN, BN_R_ARG2_LT_ARG3);
        return 0;
    }

    if (bn_wexpand(r, max) == NULL)
        return 0;

    ap = a->d;
    bp = b->d;
    rp = r->d;

    borrow = bn_sub_words(rp, ap, bp, min);
    ap += min;
    rp += min;

    while (dif) {
        dif--;
        t1 = *(ap++);
        t2 = (t1 - borrow) & BN_MASK2;
        *(rp++) = t2;
        borrow &= (t1 == 0);
    }

    while (max && *--rp == 0)
        max--;

    r->top = max;
    r->neg = 0;
    bn_pollute(r);

    return 1;
}